

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_settablesize(FuncState *fs,int pc,int ra,int asize,int hsize)

{
  byte bVar1;
  uint *puVar2;
  int local_38;
  int k;
  int rc;
  int extra;
  Instruction *inst;
  int hsize_local;
  int asize_local;
  int ra_local;
  int pc_local;
  FuncState *fs_local;
  
  puVar2 = fs->f->code + pc;
  if (hsize == 0) {
    local_38 = 0;
  }
  else {
    bVar1 = luaO_ceillog2(hsize);
    local_38 = bVar1 + 1;
  }
  *puVar2 = ra << 7 | 0x13U | local_38 << 0x10 | asize % 0x400 << 0x16 |
            (uint)(0 < asize / 0x400) << 0xf;
  puVar2[1] = asize / 0x400 << 7 | 0x52;
  return;
}

Assistant:

void luaK_settablesize (FuncState *fs, int pc, int ra, int asize, int hsize) {
  Instruction *inst = &fs->f->code[pc];
  int extra = asize / (MAXARG_vC + 1);  /* higher bits of array size */
  int rc = asize % (MAXARG_vC + 1);  /* lower bits of array size */
  int k = (extra > 0);  /* true iff needs extra argument */
  hsize = (hsize != 0) ? luaO_ceillog2(cast_uint(hsize)) + 1 : 0;
  *inst = CREATE_vABCk(OP_NEWTABLE, ra, hsize, rc, k);
  *(inst + 1) = CREATE_Ax(OP_EXTRAARG, extra);
}